

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ListAggregatesBindData>
          (Serializer *this,ListAggregatesBindData *ptr)

{
  if (ptr == (ListAggregatesBindData *)0x0) {
    (**(code **)(*(long *)this + 0x50))(this,0);
  }
  else {
    (**(code **)(*(long *)this + 0x50))(this,1);
    WriteValue<duckdb::ListAggregatesBindData>(this,ptr);
  }
  (**(code **)(*(long *)this + 0x58))(this);
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}